

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

ConstantValue * __thiscall slang::CVIterator::operator*(CVIterator *this)

{
  long lVar1;
  ConstantValue *pCVar2;
  undefined8 *puVar3;
  anon_class_1_0_00000001 local_1;
  
  lVar1 = (long)(char)*(__index_type *)
                       ((long)&(this->current).
                               super__Variant_base<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               .
                               super__Move_assign_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               .
                               super__Copy_assign_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               .
                               super__Move_ctor_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               .
                               super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               .
                               super__Variant_storage_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                       + 0x20);
  if (lVar1 != -1) {
    pCVar2 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<slang::ConstantValue_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/ConstantValue.cpp:620:9)_&&,_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
               ::_S_vtable._M_arr[lVar1]._M_data)(&local_1,&this->current);
    return pCVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_004e8fc0;
  puVar3[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

ConstantValue& CVIterator::operator*() {
    return std::visit(
        [](auto&& arg) -> ConstantValue& {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, AssociativeArray::iterator>)
                return arg->second;
            else
                return *arg;
        },
        current);
}